

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

void Of_ManComputeBackward2(Of_Man_t *p)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  Jf_Par_t *pJVar4;
  Gia_Obj_t *pGVar5;
  undefined8 uVar6;
  Of_Obj_t *pOVar7;
  void *pvVar8;
  bool bVar9;
  word wVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  word wVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  
  iVar2 = p->pPars->nDelayLut1;
  Of_ManComputeOutputRequired(p,0);
  pJVar4 = p->pPars;
  pJVar4->Area = 0;
  pJVar4->Edge = 0;
  lVar12 = (long)p->pGia->nObjs;
  if (1 < lVar12) {
    pGVar5 = p->pGia->pObjs;
    wVar10 = 0;
    wVar14 = 0;
    do {
      if (pGVar5 == (Gia_Obj_t *)0x0) {
        return;
      }
      lVar13 = lVar12 + -1;
      uVar6 = *(undefined8 *)(pGVar5 + lVar13);
      uVar11 = (uint)uVar6;
      if ((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) {
        pOVar7 = p->pObjs;
        iVar16 = pOVar7[lVar13].Required;
        if (((uVar11 & 0x1fffffff) == 0x1fffffff) ||
           ((uVar11 & 0x1fffffff) != ((uint)((ulong)uVar6 >> 0x20) & 0x1fffffff))) {
          if (pOVar7[lVar13].nRefs != 0) {
            uVar11 = pOVar7[lVar13].iCutH >> 0x10;
            if (((int)uVar11 < 0) || ((p->vPages).nSize <= (int)uVar11)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar8 = (p->vPages).pArray[uVar11];
            uVar17 = (ulong)(pOVar7[lVar13].iCutH & 0xffff);
            uVar11 = *(uint *)((long)pvVar8 + uVar17 * 4);
            uVar15 = (ulong)(uVar11 & 0x1f);
            if ((uVar11 & 0x1f) == 0) {
              uVar15 = 0;
            }
            else {
              puVar1 = (uint *)((long)pvVar8 + uVar17 * 4);
              iVar16 = iVar16 - iVar2;
              uVar17 = 0;
              do {
                uVar3 = puVar1[uVar17 + 1];
                if ((int)uVar3 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                if (uVar3 < 2) break;
                if (iVar16 < pOVar7[uVar3 >> 1].Required) {
                  pOVar7[uVar3 >> 1].Required = iVar16;
                  uVar11 = *puVar1;
                }
                uVar17 = uVar17 + 1;
                uVar15 = (ulong)(uVar11 & 0x1f);
              } while (uVar17 < uVar15);
            }
            wVar14 = wVar14 + uVar15;
            pJVar4->Edge = wVar14;
            wVar10 = wVar10 + 1;
            pJVar4->Area = wVar10;
          }
        }
        else {
          lVar18 = lVar13 - (ulong)(uVar11 & 0x1fffffff);
          if (iVar16 < pOVar7[lVar18].Required) {
            pOVar7[lVar18].Required = iVar16;
          }
        }
      }
      bVar9 = 2 < lVar12;
      lVar12 = lVar13;
    } while (bVar9);
  }
  return;
}

Assistant:

void Of_ManComputeBackward2( Of_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int DelayLut1 = p->pPars->nDelayLut1;
    int i, k, iVar, * pCutMin;
    Of_ManComputeOutputRequired( p, 0 );
    // compute area and edges
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        int Required = Of_ObjRequired(p, i);
        if ( Gia_ObjIsBuf(pObj) )
        {
            int FaninId = Gia_ObjFaninId0(pObj, i);
            Of_ObjUpdateRequired( p, FaninId, Required );
            continue;
        }
        if ( !Of_ObjRefNum(p, i) )
            continue;
        // lookup for the cut
        pCutMin = Of_ObjCutBestP( p, i );
        Of_CutForEachVar( pCutMin, iVar, k )
            Of_ObjUpdateRequired( p, iVar, Required - DelayLut1 );
        // update parameters
        p->pPars->Edge += Of_CutSize(pCutMin);
        p->pPars->Area++;
    }
}